

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOptExpr.cpp
# Opt level: O1

bool __thiscall
GlobOpt::CSEOptimize
          (GlobOpt *this,BasicBlock *block,Instr **instrRef,Value **pSrc1Val,Value **pSrc2Val,
          Value **pSrc1IndirIndexVal,bool intMathExprOnly)

{
  GlobOptBlockData *this_00;
  IRType IVar1;
  OpCode OVar2;
  Instr *pIVar3;
  ValueInfo *pVVar4;
  Opnd *pOVar5;
  StackSym *this_01;
  code *pcVar6;
  BasicBlock *pBVar7;
  bool bVar8;
  bool bVar9;
  BOOLEAN BVar10;
  OpndKind OVar11;
  ExprAttributes exprAttributes;
  uint uVar12;
  uint uVar13;
  undefined4 *puVar14;
  Value *pVVar15;
  Value **ppVVar16;
  Value *pVVar17;
  SymOpnd *pSVar18;
  PropertySymOpnd *pPVar19;
  RegOpnd *pRVar20;
  StackSym *pSVar21;
  Value *pVVar22;
  JITTimeFunctionBody *pJVar23;
  FunctionJITTimeInfo *pFVar24;
  char16 *pcVar25;
  char16 *pcVar26;
  AddrOpnd *this_02;
  Instr *this_03;
  uint uVar27;
  undefined4 uVar28;
  int32 local_78;
  uint local_74;
  int32 intConstantValue_1;
  int32 intConstantValue;
  GlobOptBlockData *local_68;
  ValueInfo *local_60;
  Value *local_58;
  BasicBlock *local_50;
  ExprHash local_44;
  char cStack_40;
  ExprHash hash;
  
  local_50 = block;
  if (instrRef == (Instr **)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar14 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar14 = 1;
    bVar8 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptExpr.cpp"
                       ,0x1d5,"(instrRef)","instrRef");
    if (!bVar8) goto LAB_0049f86c;
    *puVar14 = 0;
  }
  if (*instrRef == (Instr *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar14 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar14 = 1;
    bVar8 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptExpr.cpp"
                       ,0x1d7,"(instr)","instr");
    if (!bVar8) goto LAB_0049f86c;
    *puVar14 = 0;
  }
  bVar8 = DoCSE(this);
  if (!bVar8) {
    return false;
  }
  pVVar22 = *pSrc1Val;
  pVVar15 = *pSrc2Val;
  pVVar17 = *pSrc1IndirIndexVal;
  local_44 = (ExprHash)((uint)local_44 & 0xffffff00);
  pIVar3 = *instrRef;
  OVar2 = pIVar3->m_opcode;
  uVar27 = (uint)OVar2;
  if (OVar2 < LdElemI_A) {
    if ((uVar27 < 0x3b) && ((0x40b610000000000U >> ((ulong)uVar27 & 0x3f) & 1) != 0)) {
      if ((intMathExprOnly) && ((this->field_0xf4 & 0xc) == 0)) {
        return false;
      }
      exprAttributes.attributes = *(uint *)&this->field_0xf4 >> 2 & 3;
LAB_0049ef8d:
      bVar8 = false;
    }
    else {
LAB_0049f098:
      exprAttributes.attributes = 0;
      bVar8 = false;
      if (intMathExprOnly) {
        return false;
      }
    }
  }
  else {
    if (OVar2 - 0x1df < 2) {
      bVar8 = IRType_IsUnsignedInt(pIVar3->m_dst->m_type);
      bVar9 = IRType_IsUnsignedInt((*instrRef)->m_src1->m_type);
      exprAttributes.attributes = bVar8 + 2;
      if (!bVar9) {
        exprAttributes.attributes = (uint)bVar8;
      }
      goto LAB_0049ef8d;
    }
    if ((OVar2 != LdArrViewElem) && (uVar27 != 0x97)) goto LAB_0049f098;
    if (intMathExprOnly) {
      return false;
    }
    pOVar5 = pIVar3->m_src1;
    _cStack_40 = pVVar15;
    OVar11 = IR::Opnd::GetKind(pOVar5);
    if (OVar11 != OpndKindIndir) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar14 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar14 = 1;
      bVar8 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                         ,0x1c8,"(this->IsIndirOpnd())","Bad call to AsIndirOpnd()");
      if (!bVar8) goto LAB_0049f86c;
      *puVar14 = 0;
    }
    this_00 = &local_50->globOptData;
    pVVar22 = GlobOptBlockData::FindValue(this_00,(Sym *)pOVar5[1]._vptr_Opnd[2]);
    pVVar15 = pVVar17;
    if (pVVar17 == (Value *)0x0) {
      if (*(long *)&pOVar5[1].m_valueType != 0) {
        pVVar15 = GlobOptBlockData::FindValue
                            (this_00,*(Sym **)(*(long *)&pOVar5[1].m_valueType + 0x10));
        goto LAB_0049ef16;
      }
      bVar8 = false;
      pVVar15 = _cStack_40;
      exprAttributes.attributes = 0;
    }
    else {
LAB_0049ef16:
      bVar9 = ValueType::IsLikelyOptimizedVirtualTypedArray(&pVVar22->valueInfo->super_ValueType);
      bVar8 = true;
      exprAttributes.attributes = 0;
      if (bVar9) {
        bVar9 = (*(ushort *)&(*instrRef)->field_0x36 >> 0xe & 1) == 0;
        exprAttributes.attributes = bVar9 + 2;
        if ((short)*(ushort *)&(*instrRef)->field_0x36 < 0) {
          exprAttributes.attributes = (uint)bVar9;
        }
      }
    }
    if (!bVar8) {
      return false;
    }
  }
  _cStack_40 = pVVar15;
  bVar9 = GetHash(this,*instrRef,pVVar22,pVVar15,exprAttributes,&local_44);
  pBVar7 = local_50;
  if (!bVar9) {
    return false;
  }
  ppVVar16 = ValueHashTable<ExprHash,_Value_*>::Get
                       ((local_50->globOptData).exprToValueMap,(uint)local_44);
  if (ppVVar16 == (Value **)0x0) {
    return false;
  }
  local_68 = &pBVar7->globOptData;
  if ((*instrRef)->m_dst == (Opnd *)0x0) {
    pVVar15 = (Value *)0x0;
    _intConstantValue_1 = (StackSym *)0x0;
    local_60 = (ValueInfo *)0x0;
  }
  else {
    pVVar15 = *ppVVar16;
    if (pVVar15 == (Value *)0x0) {
      return false;
    }
    if ((bVar8) &&
       (BVar10 = BVSparse<Memory::JitArenaAllocator>::Test
                           ((pBVar7->globOptData).liveArrayValues,(BVIndex)local_44), BVar10 == '\0'
       )) {
      return false;
    }
    pVVar4 = pVVar15->valueInfo;
    _intConstantValue_1 = (StackSym *)pVVar4->symStore;
    local_60 = pVVar4;
    if (_intConstantValue_1 == (StackSym *)0x0) {
      local_58 = pVVar15;
      bVar9 = ValueInfo::TryGetIntConstantValue(pVVar4,&local_78,false);
      if (!bVar9) {
        _intConstantValue_1 = (StackSym *)0x0;
        pVVar15 = local_58;
        goto LAB_0049f0bc;
      }
      if ((bVar8) && (bVar8 = ValueType::IsIntAndLikelyTagged(&pVVar4->super_ValueType), bVar8)) {
        _intConstantValue_1 = GetTaggedIntConstantStackSym(this,local_78);
        pVVar15 = local_58;
        goto LAB_0049f0bc;
      }
      _intConstantValue_1 = (StackSym *)0x0;
      pVVar15 = local_58;
LAB_0049f12c:
      bVar8 = false;
    }
    else {
LAB_0049f0bc:
      if (_intConstantValue_1 == (StackSym *)0x0) {
        bVar8 = false;
      }
      else if ((_intConstantValue_1->super_Sym).m_kind == SymKindStack) {
        pVVar17 = GlobOptBlockData::FindValue(local_68,&_intConstantValue_1->super_Sym);
        if (pVVar17 == (Value *)0x0) goto LAB_0049f12c;
        bVar8 = pVVar17->valueNumber == pVVar15->valueNumber;
        if (bVar8) {
          local_60 = pVVar17->valueInfo;
          pVVar15 = pVVar17;
        }
      }
      else {
        bVar8 = false;
      }
    }
    if (!bVar8) {
      return false;
    }
  }
  pOVar5 = (*instrRef)->m_src1;
  if (pOVar5 != (Opnd *)0x0) {
    if (pVVar22 == (Value *)0x0) {
      return false;
    }
    if (((uint)local_44 >> 8 & 0x7ff) != pVVar22->valueNumber) {
      return false;
    }
    OVar11 = IR::Opnd::GetKind(pOVar5);
    if (OVar11 == OpndKindSym) {
      pSVar18 = IR::Opnd::AsSymOpnd(pOVar5);
      bVar8 = IR::SymOpnd::IsPropertySymOpnd(pSVar18);
      if (bVar8) {
        if ((*instrRef)->m_opcode != CheckFixedFld) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar14 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
          *puVar14 = 1;
          bVar8 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptExpr.cpp"
                             ,0x280,"(instr->m_opcode == Js::OpCode::CheckFixedFld)",
                             "instr->m_opcode == Js::OpCode::CheckFixedFld");
          if (!bVar8) goto LAB_0049f86c;
          *puVar14 = 0;
        }
        pSVar18 = IR::Opnd::AsSymOpnd(pOVar5);
        pPVar19 = IR::Opnd::AsPropertySymOpnd(&pSVar18->super_Opnd);
        if (((pPVar19->field_12).field_0.field_5.typeCheckSeqFlags & 8) == 0) {
          if (pPVar19->objTypeSpecFldInfo == (ObjTypeSpecFldInfo *)0x0) {
            return false;
          }
          bVar8 = ObjTypeSpecFldInfo::IsRootObjectNonConfigurableFieldLoad
                            (pPVar19->objTypeSpecFldInfo);
          if (!bVar8) {
            return false;
          }
        }
      }
    }
    if ((*instrRef)->m_src2 != (Opnd *)0x0) {
      if (_cStack_40 == (Value *)0x0) {
        return false;
      }
      if (((uint)local_44 >> 0x13 & 0x7ff) != _cStack_40->valueNumber) {
        return false;
      }
    }
  }
  local_58 = pVVar15;
  bVar8 = MayNeedBailOnImplicitCall(*instrRef,pVVar22,_cStack_40);
  if (!bVar8) goto LAB_0049f30d;
  OVar2 = (*instrRef)->m_opcode;
  uVar28 = (undefined4)CONCAT71((int7)((ulong)pVVar22 >> 8),1);
  if (((OVar2 != StElemI_A) &&
      (pOVar5 = (*instrRef)->m_src1, pOVar5 != (Opnd *)0x0 && OVar2 != StElemI_A_Strict)) &&
     (OVar11 = IR::Opnd::GetKind(pOVar5), OVar11 == OpndKindReg)) {
    pRVar20 = IR::Opnd::AsRegOpnd(pOVar5);
    pSVar21 = pRVar20->m_sym;
    bVar8 = GlobOptBlockData::IsTypeSpecialized(local_68,&pSVar21->super_Sym);
    if ((bVar8) ||
       (BVar10 = BVSparse<Memory::JitArenaAllocator>::Test
                           ((local_50->globOptData).liveInt32Syms,(pSVar21->super_Sym).m_id),
       BVar10 != '\0')) {
      pOVar5 = (*instrRef)->m_src2;
      if ((pOVar5 == (Opnd *)0x0) || (bVar8 = IR::Opnd::IsImmediateOpnd(pOVar5), bVar8)) {
LAB_0049f30d:
        uVar28 = 0;
      }
      else {
        OVar11 = IR::Opnd::GetKind(pOVar5);
        if (OVar11 == OpndKindReg) {
          pRVar20 = IR::Opnd::AsRegOpnd(pOVar5);
          pSVar21 = pRVar20->m_sym;
          bVar8 = GlobOptBlockData::IsTypeSpecialized(local_68,&pSVar21->super_Sym);
          if ((bVar8) ||
             (BVar10 = BVSparse<Memory::JitArenaAllocator>::Test
                                 ((local_50->globOptData).liveInt32Syms,(pSVar21->super_Sym).m_id),
             BVar10 != '\0')) goto LAB_0049f30d;
        }
      }
    }
  }
  if ((((char)uVar28 != '\0') && (pOVar5 = (*instrRef)->m_src1, pOVar5 != (Opnd *)0x0)) &&
     (OVar11 = IR::Opnd::GetKind(pOVar5), OVar11 == OpndKindReg)) {
    pRVar20 = IR::Opnd::AsRegOpnd(pOVar5);
    pSVar21 = pRVar20->m_sym;
    if ((pSVar21->field_0x1a & 1) != 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar14 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar14 = 1;
      bVar8 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptExpr.cpp"
                         ,0x2c4,"(!varSym1->IsTypeSpec())","!varSym1->IsTypeSpec()");
      if (!bVar8) goto LAB_0049f86c;
      *puVar14 = 0;
    }
    BVar10 = BVSparse<Memory::JitArenaAllocator>::Test
                       ((local_50->globOptData).liveFields,(pSVar21->super_Sym).m_id);
    if (BVar10 == '\0') {
      return false;
    }
    pOVar5 = (*instrRef)->m_src2;
    if ((pOVar5 != (Opnd *)0x0) && (OVar11 = IR::Opnd::GetKind(pOVar5), OVar11 == OpndKindReg)) {
      pRVar20 = IR::Opnd::AsRegOpnd(pOVar5);
      pSVar21 = pRVar20->m_sym;
      if ((pSVar21->field_0x1a & 1) != 0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar14 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar14 = 1;
        bVar8 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptExpr.cpp"
                           ,0x2ce,"(!varSym2->IsTypeSpec())","!varSym2->IsTypeSpec()");
        if (!bVar8) goto LAB_0049f86c;
        *puVar14 = 0;
      }
      BVar10 = BVSparse<Memory::JitArenaAllocator>::Test
                         ((local_50->globOptData).liveFields,(pSVar21->super_Sym).m_id);
      if (BVar10 == '\0') {
        return false;
      }
    }
  }
  if (((*instrRef)->m_dst == (Opnd *)0x0) ||
     (IVar1 = (*instrRef)->m_dst->m_type, pSVar21 = Sym::AsStackSym(&_intConstantValue_1->super_Sym)
     , IVar1 == pSVar21->m_type)) {
    pSVar21 = _intConstantValue_1;
    if ((*instrRef)->m_opcode != ExtendArg_A) {
      pJVar23 = JITTimeWorkItem::GetJITFunctionBody(this->func->m_workItem);
      uVar12 = JITTimeFunctionBody::GetSourceContextId(pJVar23);
      pFVar24 = JITTimeWorkItem::GetJITTimeInfo(this->func->m_workItem);
      uVar13 = FunctionJITTimeInfo::GetLocalFunctionId(pFVar24);
      bVar8 = Js::Phases::IsEnabled((Phases *)&DAT_015cd718,CSEPhase,uVar12,uVar13);
      if (bVar8) {
        pJVar23 = JITTimeWorkItem::GetJITFunctionBody(this->func->m_workItem);
        pcVar25 = JITTimeFunctionBody::GetDisplayName(pJVar23);
        Output::Print(L" --- CSE (%s): ",pcVar25);
        IR::Instr::Dump(*instrRef);
      }
      pJVar23 = JITTimeWorkItem::GetJITFunctionBody(this->func->m_workItem);
      uVar12 = JITTimeFunctionBody::GetSourceContextId(pJVar23);
      pFVar24 = JITTimeWorkItem::GetJITTimeInfo(this->func->m_workItem);
      uVar13 = FunctionJITTimeInfo::GetLocalFunctionId(pFVar24);
      bVar8 = Js::Phases::IsEnabled((Phases *)&DAT_015d3490,CSEPhase,uVar12,uVar13);
      if (bVar8) {
        pJVar23 = JITTimeWorkItem::GetJITFunctionBody(this->func->m_workItem);
        pcVar25 = JITTimeFunctionBody::GetDisplayName(pJVar23);
        pcVar26 = Js::OpCodeUtil::GetOpCodeName((*instrRef)->m_opcode);
        Output::Print(L" --- CSE (%s): %s\n",pcVar25,pcVar26);
      }
      CaptureByteCodeSymUses(this,*instrRef);
      if ((*instrRef)->m_dst == (Opnd *)0x0) {
        (*instrRef)->m_opcode = Nop;
      }
      else {
        _cStack_40 = (Value *)CONCAT44(hash,uVar28);
        if (local_60 == (ValueInfo *)0x0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar14 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
          *puVar14 = 1;
          bVar8 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptExpr.cpp"
                             ,0x305,"(valueInfo)","valueInfo");
          if (!bVar8) goto LAB_0049f86c;
          *puVar14 = 0;
        }
        pVVar4 = local_60;
        pSVar21 = Sym::AsStackSym(&_intConstantValue_1->super_Sym);
        this_02 = (AddrOpnd *)
                  IR::RegOpnd::New(pSVar21,(*instrRef)->m_dst->m_type,(*instrRef)->m_func);
        IR::Opnd::SetValueType
                  ((Opnd *)this_02,
                   (ValueType)
                   *(anon_union_2_4_ea848c7b_for_ValueType_13 *)
                    &(pVVar4->super_ValueType).field_0.field_0);
        IR::Opnd::SetIsJITOptimizedReg((Opnd *)this_02,true);
        if (cStack_40 != '\0') {
          CaptureNoImplicitCallUses(this,(Opnd *)this_02,false,(Instr *)0x0);
        }
        pVVar4 = local_60;
        bVar8 = ValueInfo::TryGetIntConstantValue(local_60,(int32 *)&local_74,false);
        if (bVar8) {
          bVar8 = ValueType::IsIntAndLikelyTagged(&pVVar4->super_ValueType);
          if (bVar8) {
            IR::Opnd::Free((Opnd *)this_02,this->func);
            this_02 = IR::AddrOpnd::New((Var)((ulong)local_74 | 0x1000000000000),
                                        AddrOpndKindConstantVar,(*instrRef)->m_func,false,(Var)0x0);
            IR::Opnd::SetValueType
                      (&this_02->super_Opnd,
                       (ValueType)
                       *(anon_union_2_4_ea848c7b_for_ValueType_13 *)
                        &(pVVar4->super_ValueType).field_0.field_0);
          }
        }
        *pSrc1Val = local_58;
        pIVar3 = *instrRef;
        this_03 = IR::Instr::New(Ld_A,pIVar3->m_dst,&this_02->super_Opnd,pIVar3->m_func);
        *instrRef = this_03;
        IR::Instr::SetByteCodeOffset(this_03,pIVar3);
        IR::Instr::TransferDstAttributesTo(pIVar3,*instrRef);
        pBVar7 = local_50;
        BasicBlock::InsertInstrBefore(local_50,*instrRef,pIVar3);
        BasicBlock::RemoveInstr(pBVar7,pIVar3);
        *pSrc2Val = (Value *)0x0;
        *pSrc1IndirIndexVal = (Value *)0x0;
      }
      return true;
    }
    pOVar5 = (*instrRef)->m_dst;
    pVVar22 = GlobOptBlockData::FindValue
                        (&this->currentBlock->globOptData,&_intConstantValue_1->super_Sym);
    GlobOptBlockData::SetValue(&this->currentBlock->globOptData,pVVar22,pOVar5);
    pRVar20 = IR::Opnd::AsRegOpnd(pOVar5);
    this_01 = pRVar20->m_sym;
    pSVar21 = Sym::AsStackSym(&pSVar21->super_Sym);
    StackSym::CopySymAttrs(this_01,pSVar21);
  }
  else if ((this->field_0xf7 & 2) == 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar14 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar14 = 1;
    bVar8 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptExpr.cpp"
                       ,0x2dc,"(GetIsAsmJSFunc())","GetIsAsmJSFunc()");
    if (!bVar8) {
LAB_0049f86c:
      pcVar6 = (code *)invalidInstructionException();
      (*pcVar6)();
    }
    *puVar14 = 0;
  }
  return false;
}

Assistant:

bool
GlobOpt::CSEOptimize(BasicBlock *block, IR::Instr * *const instrRef, Value **pSrc1Val, Value **pSrc2Val, Value **pSrc1IndirIndexVal, bool intMathExprOnly)
{
    Assert(instrRef);
    IR::Instr *&instr = *instrRef;
    Assert(instr);
    if (!this->DoCSE())
    {
        return false;
    }

    Value *src1Val = *pSrc1Val;
    Value *src2Val = *pSrc2Val;
    Value *src1IndirIndexVal = *pSrc1IndirIndexVal;
    bool isArray = false;
    ExprAttributes exprAttributes;
    ExprHash hash;

    // For arrays, hash the value # of the baseOpnd and indexOpnd
    switch(instr->m_opcode)
    {
        case Js::OpCode::LdArrViewElem:
        case Js::OpCode::LdElemI_A:
        {
            if(intMathExprOnly)
            {
                return false;
            }

            IR::IndirOpnd *arrayOpnd = instr->GetSrc1()->AsIndirOpnd();

            src1Val = block->globOptData.FindValue(arrayOpnd->GetBaseOpnd()->m_sym);
            if(src1IndirIndexVal)
            {
                src2Val = src1IndirIndexVal;
            }
            else if (arrayOpnd->GetIndexOpnd())
            {
                src2Val = block->globOptData.FindValue(arrayOpnd->GetIndexOpnd()->m_sym);
            }
            else
            {
                return false;
            }
            // for typed array do not add instructions whose dst are guaranteed to be int or number
            // as we will try to eliminate bound check for these typed arrays
            if (src1Val->GetValueInfo()->IsLikelyOptimizedVirtualTypedArray())
            {
                exprAttributes = DstIsIntOrNumberAttributes(!instr->dstIsAlwaysConvertedToInt32, !instr->dstIsAlwaysConvertedToNumber);
            }
            isArray = true;
            break;
        }

        case Js::OpCode::Neg_A:
        case Js::OpCode::Add_A:
        case Js::OpCode::Sub_A:
        case Js::OpCode::Mul_A:
        case Js::OpCode::Div_A:
        case Js::OpCode::Rem_A:
        case Js::OpCode::ShrU_A:
            // If the previously-computed matching expression ignored int overflow or negative zero, those attributes must match
            // to be able to CSE this expression
            if(intMathExprOnly && !ignoredIntOverflowForCurrentInstr && !ignoredNegativeZeroForCurrentInstr)
            {
                // Already tried CSE with default attributes
                return false;
            }
            exprAttributes = IntMathExprAttributes(ignoredIntOverflowForCurrentInstr, ignoredNegativeZeroForCurrentInstr);
            break;

        case Js::OpCode::Conv_Prim:
        case Js::OpCode::Conv_Prim_Sat:
            exprAttributes = ConvAttributes(instr->GetDst()->IsUnsigned(), instr->GetSrc1()->IsUnsigned());
            break;

        default:
            if(intMathExprOnly)
            {
                return false;
            }
            break;
    }

    if (!this->GetHash(instr, src1Val, src2Val, exprAttributes, &hash))
    {
        return false;
    }

    // See if we have a value for that expression
    Value ** pVal = block->globOptData.exprToValueMap->Get(hash);

    if (pVal == NULL)
    {
        return false;
    }

    ValueInfo *valueInfo = NULL;
    Sym *symStore = NULL;
    Value *val = NULL;

    if (instr->GetDst())
    {

        if (*pVal == NULL)
        {
            return false;
        }

        val = *pVal;

        // Make sure the array value is still live.  We can't CSE something like:
        //    ... = A[i];
        //   B[j] = ...;
        //    ... = A[i];
        if (isArray && !block->globOptData.liveArrayValues->Test(hash))
        {
            return false;
        }

        // See if the symStore is still valid
        valueInfo = val->GetValueInfo();
        symStore = valueInfo->GetSymStore();
        Value * symStoreVal = NULL;

        int32 intConstantValue;
        if (!symStore && valueInfo->TryGetIntConstantValue(&intConstantValue))
        {
            // Handle:
            //  A[i] = 10;
            //    ... = A[i];
            if (!isArray)
            {
                return false;
            }
            if (!valueInfo->IsIntAndLikelyTagged())
            {
                return false;
            }

            symStore = GetTaggedIntConstantStackSym(intConstantValue);
        }

        if(!symStore || !symStore->IsStackSym())
        {
            return false;
        }
        symStoreVal = block->globOptData.FindValue(symStore);

        if (!symStoreVal || symStoreVal->GetValueNumber() != val->GetValueNumber())
        {
            return false;
        }
        val = symStoreVal;
        valueInfo = val->GetValueInfo();
    }

    // Make sure srcs still have same values

    if (instr->GetSrc1())
    {
        if (!src1Val)
        {
            return false;
        }
        if (hash.GetSrc1ValueNumber() != src1Val->GetValueNumber())
        {
            return false;
        }

        IR::Opnd *src1 = instr->GetSrc1();

        if (src1->IsSymOpnd() && src1->AsSymOpnd()->IsPropertySymOpnd())
        {
            Assert(instr->m_opcode == Js::OpCode::CheckFixedFld);
            IR::PropertySymOpnd *propOpnd = src1->AsSymOpnd()->AsPropertySymOpnd();

            if (!propOpnd->IsTypeChecked() && !propOpnd->IsRootObjectNonConfigurableFieldLoad())
            {
                // Require m_CachedTypeChecked for 2 reasons:
                // - We may be relying on this instruction to do a type check for a downstream reference.
                // - This instruction may have a different inline cache, and thus need to check a different type,
                //   than the upstream check.
                // REVIEW: We could process this differently somehow to get the type check on the next reference.
                return false;
            }
        }
        if (instr->GetSrc2())
        {
            if (!src2Val)
            {
                return false;
            }
            if (hash.GetSrc2ValueNumber() != src2Val->GetValueNumber())
            {
                return false;
            }
        }
    }
    bool needsBailOnImplicitCall = false;

    // Need implicit call bailouts?
    if (this->MayNeedBailOnImplicitCall(instr, src1Val, src2Val))
    {
        needsBailOnImplicitCall = true;

        IR::Opnd *src1 = instr->GetSrc1();

        if (instr->m_opcode != Js::OpCode::StElemI_A && instr->m_opcode != Js::OpCode::StElemI_A_Strict
            && src1 && src1->IsRegOpnd())
        {
            StackSym *sym1 = src1->AsRegOpnd()->m_sym;

            if (block->globOptData.IsTypeSpecialized(sym1) || block->globOptData.liveInt32Syms->Test(sym1->m_id))
            {
                IR::Opnd *src2 = instr->GetSrc2();

                if (!src2 || src2->IsImmediateOpnd())
                {
                    needsBailOnImplicitCall = false;
                }
                else if (src2->IsRegOpnd())
                {
                    StackSym *sym2 = src2->AsRegOpnd()->m_sym;
                    if (block->globOptData.IsTypeSpecialized(sym2) || block->globOptData.liveInt32Syms->Test(sym2->m_id))
                    {
                        needsBailOnImplicitCall = false;
                    }
                }
            }
        }
    }

    if (needsBailOnImplicitCall)
    {
        IR::Opnd *src1 = instr->GetSrc1();
        if (src1)
        {
            if (src1->IsRegOpnd())
            {
                StackSym *varSym1 = src1->AsRegOpnd()->m_sym;

                Assert(!varSym1->IsTypeSpec());
                if (!block->globOptData.liveFields->Test(varSym1->m_id))
                {
                    return false;
                }
                IR::Opnd *src2 = instr->GetSrc2();
                if (src2 && src2->IsRegOpnd())
                {
                    StackSym *varSym2 = src2->AsRegOpnd()->m_sym;

                    Assert(!varSym2->IsTypeSpec());
                    if (!block->globOptData.liveFields->Test(varSym2->m_id))
                    {
                        return false;
                    }
                }
            }
        }
    }
    // in asmjs we can have a symstore with a different type
    //  x = HEAPF32[i >> 2]
    //  y  = HEAPI32[i >> 2]
    if (instr->GetDst() && (instr->GetDst()->GetType() != symStore->AsStackSym()->GetType()))
    {
        Assert(GetIsAsmJSFunc());
        return false;
    }

    // SIMD_JS
    if (instr->m_opcode == Js::OpCode::ExtendArg_A)
    {
        // we don't want to CSE ExtendArgs, only the operation using them. To do that, we mimic CSE by transferring the symStore valueInfo to the dst.
        IR::Opnd *dst = instr->GetDst();
        Value *dstVal = this->currentBlock->globOptData.FindValue(symStore);
        this->currentBlock->globOptData.SetValue(dstVal, dst);
        dst->AsRegOpnd()->m_sym->CopySymAttrs(symStore->AsStackSym());
        return false;
    }

    //
    // Success, do the CSE rewrite.
    //

#if DBG_DUMP
    if (Js::Configuration::Global.flags.Trace.IsEnabled(Js::CSEPhase, this->func->GetSourceContextId(), this->func->GetLocalFunctionId()))
    {
        Output::Print(_u(" --- CSE (%s): "), this->func->GetJITFunctionBody()->GetDisplayName());
        instr->Dump();
    }
#endif
#if ENABLE_DEBUG_CONFIG_OPTIONS
    if (Js::Configuration::Global.flags.TestTrace.IsEnabled(Js::CSEPhase, this->func->GetSourceContextId(), this->func->GetLocalFunctionId()))
    {
        Output::Print(_u(" --- CSE (%s): %s\n"), this->func->GetJITFunctionBody()->GetDisplayName(), Js::OpCodeUtil::GetOpCodeName(instr->m_opcode));
    }
#endif

    this->CaptureByteCodeSymUses(instr);

    if (!instr->GetDst())
    {
        instr->m_opcode = Js::OpCode::Nop;
        return true;
    }

    AnalysisAssert(valueInfo);

    IR::Opnd *cseOpnd;

    cseOpnd = IR::RegOpnd::New(symStore->AsStackSym(), instr->GetDst()->GetType(), instr->m_func);
    cseOpnd->SetValueType(valueInfo->Type());
    cseOpnd->SetIsJITOptimizedReg(true);

    if (needsBailOnImplicitCall)
    {
        this->CaptureNoImplicitCallUses(cseOpnd, false);
    }

    int32 intConstantValue;
    if (valueInfo->TryGetIntConstantValue(&intConstantValue) && valueInfo->IsIntAndLikelyTagged())
    {
        cseOpnd->Free(func);
        cseOpnd = IR::AddrOpnd::New(Js::TaggedInt::ToVarUnchecked(intConstantValue), IR::AddrOpndKindConstantVar, instr->m_func);
        cseOpnd->SetValueType(valueInfo->Type());
    }

    *pSrc1Val = val;

    {
        // Profiled instructions have data that is interpreted differently based on the op code. Since we're changing the op
        // code and due to other similar potential issues, always create a new instr instead of changing the existing one.
        IR::Instr *const originalInstr = instr;
        instr = IR::Instr::New(Js::OpCode::Ld_A, instr->GetDst(), cseOpnd, instr->m_func);
        instr->SetByteCodeOffset(originalInstr);
        originalInstr->TransferDstAttributesTo(instr);
        block->InsertInstrBefore(instr, originalInstr);
        block->RemoveInstr(originalInstr);
    }

    *pSrc2Val = NULL;
    *pSrc1IndirIndexVal = NULL;
    return true;
}